

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

MemoryCopy * __thiscall
wasm::Builder::makeMemoryCopy
          (Builder *this,Expression *dest,Expression *source,Expression *size,Name destMemory,
          Name sourceMemory)

{
  MemoryCopy *pMVar1;
  
  pMVar1 = MixedArena::alloc<wasm::MemoryCopy>((MixedArena *)(this->wasm + 0x200));
  pMVar1->dest = dest;
  pMVar1->source = source;
  pMVar1->size = size;
  (pMVar1->destMemory).super_IString.str._M_len = destMemory.super_IString.str._M_len;
  (pMVar1->destMemory).super_IString.str._M_str = destMemory.super_IString.str._M_str;
  (pMVar1->sourceMemory).super_IString.str._M_len = sourceMemory.super_IString.str._M_len;
  (pMVar1->sourceMemory).super_IString.str._M_str = sourceMemory.super_IString.str._M_str;
  wasm::MemoryCopy::finalize();
  return pMVar1;
}

Assistant:

MemoryCopy* makeMemoryCopy(Expression* dest,
                             Expression* source,
                             Expression* size,
                             Name destMemory,
                             Name sourceMemory) {
    auto* ret = wasm.allocator.alloc<MemoryCopy>();
    ret->dest = dest;
    ret->source = source;
    ret->size = size;
    ret->destMemory = destMemory;
    ret->sourceMemory = sourceMemory;
    ret->finalize();
    return ret;
  }